

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O1

CordRep * absl::lts_20250127::cord_internal::CordRepBtree::RemoveSuffix(CordRepBtree *tree,size_t n)

{
  RefcountAndFlags *pRVar1;
  long lVar2;
  uint uVar3;
  uint8_t uVar4;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  CordRepBtree *pCVar8;
  CordRep *pCVar9;
  ulong uVar10;
  CordRepBtree *pCVar11;
  ulong uVar12;
  uint uVar13;
  size_t sVar14;
  CordRepBtree *this;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  CopyResult CVar19;
  CordRepBtree *local_48;
  
  if (tree == (CordRepBtree *)0x0) {
    __assert_fail("tree != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x34b,
                  "static CordRep *absl::cord_internal::CordRepBtree::RemoveSuffix(CordRepBtree *, size_t)"
                 );
  }
  uVar6 = (tree->super_CordRep).length;
  if (uVar6 < n) {
    __assert_fail("n <= tree->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x34c,
                  "static CordRep *absl::cord_internal::CordRepBtree::RemoveSuffix(CordRepBtree *, size_t)"
                 );
  }
  if (n == 0) {
    return &tree->super_CordRep;
  }
  uVar12 = uVar6 - n;
  if (uVar6 < n || uVar12 == 0) {
    CordRep::Unref(&tree->super_CordRep);
    return (CordRep *)0x0;
  }
  bVar17 = (tree->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2;
  uVar6 = (tree->super_CordRep).length;
  if (uVar12 <= uVar6) {
    uVar16 = (ulong)(tree->super_CordRep).storage[2];
    uVar6 = uVar6 - uVar12;
    do {
      uVar10 = uVar6;
      lVar2 = uVar16 * 8;
      uVar16 = uVar16 - 1;
      uVar15 = **(ulong **)((tree->super_CordRep).storage + lVar2 + -5);
      uVar6 = uVar10 - uVar15;
    } while (uVar15 <= uVar10);
    uVar15 = uVar15 - uVar10;
    uVar13 = (uint)(tree->super_CordRep).storage[0];
    while (uVar16 == (tree->super_CordRep).storage[1]) {
      pCVar8 = (CordRepBtree *)ExtractFront(tree);
      bVar17 = (bool)(bVar17 & (pCVar8->super_CordRep).refcount.count_.super___atomic_base<int>._M_i
                               == 2);
      if (uVar13 == 0) {
        local_48 = (CordRepBtree *)anon_unknown_0::ResizeEdge((CordRep *)pCVar8,uVar12,bVar17);
        pCVar8 = tree;
      }
      else {
        if ((pCVar8->super_CordRep).tag != '\x03') goto LAB_0034133b;
        uVar6 = (pCVar8->super_CordRep).length;
        if (uVar6 < uVar12) goto LAB_0034135a;
        uVar16 = (ulong)(pCVar8->super_CordRep).storage[2];
        uVar6 = uVar6 - uVar12;
        do {
          uVar10 = uVar6;
          lVar2 = uVar16 * 8;
          uVar16 = uVar16 - 1;
          uVar15 = **(ulong **)((pCVar8->super_CordRep).storage + lVar2 + -5);
          uVar6 = uVar10 - uVar15;
        } while (uVar15 <= uVar10);
        uVar15 = uVar15 - uVar10;
      }
      bVar18 = uVar13 == 0;
      tree = pCVar8;
      uVar13 = uVar13 - 1;
      if (bVar18) {
        return &local_48->super_CordRep;
      }
    }
    pCVar8 = ConsumeBeginTo(tree,uVar16 + 1,uVar12);
    if (uVar16 < (pCVar8->super_CordRep).storage[1]) {
LAB_00341398:
      __assert_fail("index >= begin()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x268,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
    }
    if ((pCVar8->super_CordRep).storage[2] <= uVar16) {
LAB_003413b7:
      __assert_fail("index < end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x269,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
    }
    this = (CordRepBtree *)pCVar8->edges_[uVar16];
    pCVar11 = pCVar8;
    do {
      if (uVar15 == (this->super_CordRep).length) {
        AssertValid(pCVar8,true);
        return &pCVar8->super_CordRep;
      }
      if ((pCVar11->super_CordRep).refcount.count_.super___atomic_base<int>._M_i != 2) {
        __assert_fail("tree->refcount.IsOne()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                      ,0x36e,
                      "static CordRep *absl::cord_internal::CordRepBtree::RemoveSuffix(CordRepBtree *, size_t)"
                     );
      }
      iVar5 = (this->super_CordRep).refcount.count_.super___atomic_base<int>._M_i;
      bVar17 = uVar13 == 0;
      uVar13 = uVar13 - 1;
      if (bVar17) {
        pCVar9 = anon_unknown_0::ResizeEdge(&this->super_CordRep,uVar15,iVar5 == 2);
        pCVar11->edges_[uVar16] = pCVar9;
LAB_003412d8:
        AssertValid(pCVar8,true);
        bVar17 = false;
        local_48 = pCVar8;
      }
      else {
        uVar4 = (this->super_CordRep).tag;
        if (iVar5 != 2) {
          if (uVar4 == '\x03') {
            CVar19 = CopyPrefix(this,uVar15,false);
            pCVar11->edges_[uVar16] = CVar19.edge;
            LOCK();
            pRVar1 = &(this->super_CordRep).refcount;
            uVar3 = (pRVar1->count_).super___atomic_base<int>._M_i;
            (pRVar1->count_).super___atomic_base<int>._M_i =
                 (pRVar1->count_).super___atomic_base<int>._M_i + -2;
            UNLOCK();
            if ((uVar3 & 1) == 0 && (int)uVar3 < 1) {
              __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                            ,0xac,
                            "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()"
                           );
            }
            if (uVar3 == 2) {
              CordRep::Destroy(&this->super_CordRep);
            }
            goto LAB_003412d8;
          }
          goto LAB_0034133b;
        }
        if (uVar4 != '\x03') {
LAB_0034133b:
          __assert_fail("IsBtree()",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                        ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
        }
        uVar6 = (this->super_CordRep).length;
        if (uVar6 < uVar15) break;
        uVar6 = uVar6 - uVar15;
        sVar7 = (ulong)(this->super_CordRep).storage[2] + 1;
        do {
          sVar14 = sVar7;
          uVar10 = uVar6;
          uVar12 = **(ulong **)((this->super_CordRep).storage + sVar14 * 8 + -0xd);
          uVar6 = uVar10 - uVar12;
          sVar7 = sVar14 - 1;
        } while (uVar12 <= uVar10);
        pCVar11 = ConsumeBeginTo(this,sVar14 - 1,uVar15);
        uVar16 = sVar14 - 2;
        if (uVar16 < (pCVar11->super_CordRep).storage[1]) goto LAB_00341398;
        if ((pCVar11->super_CordRep).storage[2] <= uVar16) goto LAB_003413b7;
        uVar15 = uVar12 - uVar10;
        this = *(CordRepBtree **)((pCVar11->super_CordRep).storage + sVar14 * 8 + -0xd);
        bVar17 = true;
      }
      if (!bVar17) {
        return &local_48->super_CordRep;
      }
    } while( true );
  }
LAB_0034135a:
  __assert_fail("n <= length",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                ,0x340,
                "CordRepBtree::Position absl::cord_internal::CordRepBtree::IndexOfLength(size_t) const"
               );
}

Assistant:

CordRep* CordRepBtree::RemoveSuffix(CordRepBtree* tree, size_t n) {
  // Check input and deal with trivial cases 'Remove all/none'
  assert(tree != nullptr);
  assert(n <= tree->length);
  const size_t len = tree->length;
  if (ABSL_PREDICT_FALSE(n == 0)) {
    return tree;
  }
  if (ABSL_PREDICT_FALSE(n >= len)) {
    CordRepBtree::Unref(tree);
    return nullptr;
  }

  size_t length = len - n;
  int height = tree->height();
  bool is_mutable = tree->refcount.IsOne();

  // Extract all top nodes which are reduced to size = 1
  Position pos = tree->IndexOfLength(length);
  while (pos.index == tree->begin()) {
    CordRep* edge = ExtractFront(tree);
    is_mutable &= edge->refcount.IsOne();
    if (height-- == 0) return ResizeEdge(edge, length, is_mutable);
    tree = edge->btree();
    pos = tree->IndexOfLength(length);
  }

  // Repeat the following sequence traversing down the tree:
  // - Crop the top node to the 'last remaining edge' adjusting length.
  // - Set the length for down edges to the partial length in that last edge.
  // - Repeat this until the last edge is 'included in full'
  // - If we hit the data edge level, resize and return the last data edge
  CordRepBtree* top = tree = ConsumeBeginTo(tree, pos.index + 1, length);
  CordRep* edge = tree->Edge(pos.index);
  length = pos.n;
  while (length != edge->length) {
    // ConsumeBeginTo guarantees `tree` is a clean, privately owned copy.
    assert(tree->refcount.IsOne());
    const bool edge_is_mutable = edge->refcount.IsOne();

    if (height-- == 0) {
      tree->edges_[pos.index] = ResizeEdge(edge, length, edge_is_mutable);
      return AssertValid(top);
    }

    if (!edge_is_mutable) {
      // We can't 'in place' remove any suffixes down this edge.
      // Replace this edge with a prefix copy instead.
      tree->edges_[pos.index] = edge->btree()->CopyPrefix(length, false).edge;
      CordRep::Unref(edge);
      return AssertValid(top);
    }

    // Move down one level, rinse repeat.
    tree = edge->btree();
    pos = tree->IndexOfLength(length);
    tree = ConsumeBeginTo(edge->btree(), pos.index + 1, length);
    edge = tree->Edge(pos.index);
    length = pos.n;
  }

  return AssertValid(top);
}